

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Matrix<float,_2,_2>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_2,_2>_> *this,EvalContext *ctx)

{
  Environment *this_00;
  Variable<tcu::Matrix<float,_2,_2>_> *variable;
  Expr<tcu::Matrix<float,_2,_2>_> *pEVar1;
  Vector<tcu::Interval,_2> *pVVar2;
  IVal *pIVar3;
  IVal local_80;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
               m_ptr;
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
             super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_80,pEVar1,ctx);
    Environment::bind<tcu::Matrix<float,2,2>>(this_00,variable,&local_80);
  }
  else {
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
             super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_80,pEVar1,ctx);
    pIVar3 = Environment::lookup<tcu::Matrix<float,2,2>>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                                 .m_ptr);
    (pIVar3->m_data).m_data[0].m_data[0].m_hi = local_80.m_data.m_data[0].m_data[0].m_hi;
    (pIVar3->m_data).m_data[0].m_data[0].m_hasNaN = local_80.m_data.m_data[0].m_data[0].m_hasNaN;
    *(undefined7 *)&(pIVar3->m_data).m_data[0].m_data[0].field_0x1 =
         local_80.m_data.m_data[0].m_data[0]._1_7_;
    (pIVar3->m_data).m_data[0].m_data[0].m_lo = local_80.m_data.m_data[0].m_data[0].m_lo;
    (pIVar3->m_data).m_data[1].m_data[0].m_hi = local_80.m_data.m_data[1].m_data[0].m_hi;
    (pIVar3->m_data).m_data[1].m_data[0].m_hasNaN = local_80.m_data.m_data[1].m_data[0].m_hasNaN;
    *(undefined7 *)&(pIVar3->m_data).m_data[1].m_data[0].field_0x1 =
         local_80.m_data.m_data[1].m_data[0]._1_7_;
    (pIVar3->m_data).m_data[1].m_data[0].m_lo = local_80.m_data.m_data[1].m_data[0].m_lo;
    (pIVar3->m_data).m_data[0].m_data[1].m_hi = local_80.m_data.m_data[0].m_data[1].m_hi;
    (pIVar3->m_data).m_data[0].m_data[1].m_hasNaN = local_80.m_data.m_data[0].m_data[1].m_hasNaN;
    *(undefined7 *)&(pIVar3->m_data).m_data[0].m_data[1].field_0x1 =
         local_80.m_data.m_data[0].m_data[1]._1_7_;
    (pIVar3->m_data).m_data[0].m_data[1].m_lo = local_80.m_data.m_data[0].m_data[1].m_lo;
    pVVar2 = (pIVar3->m_data).m_data;
    pVVar2[1].m_data[1].m_hasNaN = local_80.m_data.m_data[1].m_data[1].m_hasNaN;
    *(undefined7 *)&pVVar2[1].m_data[1].field_0x1 = local_80.m_data.m_data[1].m_data[1]._1_7_;
    (pIVar3->m_data).m_data[1].m_data[1].m_lo = local_80.m_data.m_data[1].m_data[1].m_lo;
    (pIVar3->m_data).m_data[1].m_data[1].m_hi = local_80.m_data.m_data[1].m_data[1].m_hi;
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}